

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg-gvec-desc.h
# Opt level: O2

void helper_gvec_umin64_m68k(void *d,void *a,void *b,uint32_t desc)

{
  ulong oprsz;
  ulong uVar1;
  ulong uVar2;
  
  oprsz = (ulong)((desc & 0x1f) * 8 + 8);
  for (uVar1 = 0; uVar1 < oprsz; uVar1 = uVar1 + 8) {
    uVar2 = *(ulong *)((long)b + uVar1);
    if (*(ulong *)((long)a + uVar1) < *(ulong *)((long)b + uVar1)) {
      uVar2 = *(ulong *)((long)a + uVar1);
    }
    *(ulong *)((long)d + uVar1) = uVar2;
  }
  clear_high(d,oprsz,desc);
  return;
}

Assistant:

static inline intptr_t simd_oprsz(uint32_t desc)
{
    return (extract32(desc, SIMD_OPRSZ_SHIFT, SIMD_OPRSZ_BITS) + 1) * 8;
}